

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<4,_1,_false,_embree::avx::SubGridIntersector1Moeller<4,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  long lVar7;
  RTCIntersectArguments *pRVar8;
  RTCRayQueryContext *pRVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined4 uVar56;
  float fVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  uint uVar69;
  undefined4 uVar70;
  int iVar71;
  ulong uVar72;
  byte bVar73;
  undefined4 uVar74;
  ulong uVar75;
  long lVar76;
  long lVar77;
  uint uVar78;
  ulong uVar79;
  uint uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong unaff_R12;
  size_t mask;
  GridMesh *mesh;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  long lVar88;
  long lVar89;
  bool bVar90;
  float fVar91;
  float fVar99;
  float fVar100;
  vint4 ai_1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar107;
  float fVar116;
  float fVar117;
  vint4 ai;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar122;
  float fVar123;
  float fVar134;
  float fVar135;
  vint4 ai_3;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  vint4 ai_2;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  float fVar168;
  uint uVar169;
  float fVar171;
  uint uVar172;
  float fVar173;
  uint uVar174;
  float fVar175;
  uint uVar176;
  float fVar177;
  uint uVar178;
  float fVar179;
  uint uVar180;
  float fVar181;
  uint uVar182;
  uint uVar183;
  undefined1 auVar170 [64];
  float fVar184;
  undefined1 auVar185 [32];
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar186 [64];
  float fVar193;
  undefined1 auVar194 [32];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar195 [64];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx::UVIdentity<8>_> hit;
  NodeRef stack [244];
  int local_be4;
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  undefined1 local_b70 [16];
  ulong local_b60;
  ulong local_b58;
  ulong local_b50;
  ulong local_b48;
  ulong local_b40;
  ulong local_b38;
  ulong local_b30;
  ulong *local_b28;
  ulong local_b20;
  ulong local_b18;
  ulong local_b10;
  ulong local_b08;
  ulong local_b00;
  ulong local_af8;
  ulong local_af0;
  ulong local_ae8;
  ulong local_ae0;
  ulong local_ad8;
  ulong local_ad0;
  long local_ac8;
  float local_ac0;
  float local_abc;
  float local_ab8;
  undefined4 local_ab4;
  float local_ab0;
  uint local_aac;
  uint local_aa8;
  uint local_aa4;
  uint local_aa0;
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  float local_8e0 [4];
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [32];
  ulong local_800;
  ulong local_7f8 [249];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar107 = ray->tfar;
    if (0.0 <= fVar107) {
      local_b28 = local_7f8;
      aVar1 = (ray->dir).field_0;
      auVar92 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar94._8_4_ = 0x7fffffff;
      auVar94._0_8_ = 0x7fffffff7fffffff;
      auVar94._12_4_ = 0x7fffffff;
      auVar94 = vandps_avx((undefined1  [16])aVar1,auVar94);
      auVar154._8_4_ = 0x219392ef;
      auVar154._0_8_ = 0x219392ef219392ef;
      auVar154._12_4_ = 0x219392ef;
      auVar94 = vcmpps_avx(auVar94,auVar154,1);
      auVar94 = vblendvps_avx((undefined1  [16])aVar1,auVar154,auVar94);
      local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar154 = vrcpps_avx(auVar94);
      fVar100 = auVar154._0_4_;
      auVar140._0_4_ = fVar100 * auVar94._0_4_;
      fVar101 = auVar154._4_4_;
      auVar140._4_4_ = fVar101 * auVar94._4_4_;
      fVar102 = auVar154._8_4_;
      auVar140._8_4_ = fVar102 * auVar94._8_4_;
      fVar104 = auVar154._12_4_;
      auVar140._12_4_ = fVar104 * auVar94._12_4_;
      auVar155._8_4_ = 0x3f800000;
      auVar155._0_8_ = &DAT_3f8000003f800000;
      auVar155._12_4_ = 0x3f800000;
      auVar94 = vsubps_avx(auVar155,auVar140);
      auVar141._0_4_ = fVar100 + fVar100 * auVar94._0_4_;
      auVar141._4_4_ = fVar101 + fVar101 * auVar94._4_4_;
      auVar141._8_4_ = fVar102 + fVar102 * auVar94._8_4_;
      auVar141._12_4_ = fVar104 + fVar104 * auVar94._12_4_;
      uVar70 = *(undefined4 *)&(ray->org).field_0;
      local_b70._4_4_ = uVar70;
      local_b70._0_4_ = uVar70;
      local_b70._8_4_ = uVar70;
      local_b70._12_4_ = uVar70;
      auVar164 = ZEXT1664(local_b70);
      uVar70 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_b80._4_4_ = uVar70;
      local_b80._0_4_ = uVar70;
      local_b80._8_4_ = uVar70;
      local_b80._12_4_ = uVar70;
      auVar167 = ZEXT1664(local_b80);
      uVar70 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_b90._4_4_ = uVar70;
      local_b90._0_4_ = uVar70;
      local_b90._8_4_ = uVar70;
      local_b90._12_4_ = uVar70;
      auVar170 = ZEXT1664(local_b90);
      local_ba0 = vshufps_avx(auVar141,auVar141,0);
      auVar186 = ZEXT1664(local_ba0);
      auVar94 = vmovshdup_avx(auVar141);
      local_bb0 = vshufps_avx(auVar141,auVar141,0x55);
      auVar195 = ZEXT1664(local_bb0);
      auVar154 = vshufpd_avx(auVar141,auVar141,1);
      uVar72 = (ulong)(auVar141._0_4_ < 0.0) << 4;
      uVar82 = (ulong)(auVar94._0_4_ < 0.0) << 4 | 0x20;
      local_bc0 = vshufps_avx(auVar141,auVar141,0xaa);
      auVar203 = ZEXT1664(local_bc0);
      uVar83 = (ulong)(auVar154._0_4_ < 0.0) << 4 | 0x40;
      uVar84 = uVar72 ^ 0x10;
      uVar79 = uVar82 ^ 0x10;
      uVar87 = uVar83 ^ 0x10;
      local_bd0 = vshufps_avx(auVar92,auVar92,0);
      auVar205 = ZEXT1664(local_bd0);
      local_be0 = vshufps_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar107),0);
      auVar207 = ZEXT1664(local_be0);
      local_af8 = (ulong)(((uint)(auVar141._0_4_ < 0.0) << 4) >> 2);
      local_b00 = uVar84 >> 2;
      local_b08 = uVar82 >> 2;
      local_b10 = uVar79 >> 2;
      local_9e0._16_16_ = mm_lookupmask_ps._240_16_;
      local_9e0._0_16_ = mm_lookupmask_ps._240_16_;
      local_b18 = uVar83 >> 2;
      local_820 = vperm2f128_avx(local_9e0,mm_lookupmask_ps._0_32_,2);
      local_b20 = uVar87 >> 2;
      auVar97._8_4_ = 0xbf800000;
      auVar97._0_8_ = 0xbf800000bf800000;
      auVar97._12_4_ = 0xbf800000;
      auVar97._16_4_ = 0xbf800000;
      auVar97._20_4_ = 0xbf800000;
      auVar97._24_4_ = 0xbf800000;
      auVar97._28_4_ = 0xbf800000;
      auVar131._8_4_ = 0x3f800000;
      auVar131._0_8_ = &DAT_3f8000003f800000;
      auVar131._12_4_ = 0x3f800000;
      auVar131._16_4_ = 0x3f800000;
      auVar131._20_4_ = 0x3f800000;
      auVar131._24_4_ = 0x3f800000;
      auVar131._28_4_ = 0x3f800000;
      _local_840 = vblendvps_avx(auVar131,auVar97,local_820);
      local_b38 = uVar72;
      local_b40 = uVar82;
      local_b48 = uVar83;
      local_b50 = uVar84;
      local_b58 = uVar79;
      local_b60 = uVar87;
      do {
        if (local_b28 == &local_800) {
          return;
        }
        uVar86 = local_b28[-1];
        local_b28 = local_b28 + -1;
        local_b30 = unaff_R12;
        do {
          if ((uVar86 & 8) == 0) {
            auVar94 = vsubps_avx(*(undefined1 (*) [16])(uVar86 + 0x20 + uVar72),auVar164._0_16_);
            auVar92._0_4_ = auVar186._0_4_ * auVar94._0_4_;
            auVar92._4_4_ = auVar186._4_4_ * auVar94._4_4_;
            auVar92._8_4_ = auVar186._8_4_ * auVar94._8_4_;
            auVar92._12_4_ = auVar186._12_4_ * auVar94._12_4_;
            auVar94 = vsubps_avx(*(undefined1 (*) [16])(uVar86 + 0x20 + uVar82),auVar167._0_16_);
            auVar108._0_4_ = auVar195._0_4_ * auVar94._0_4_;
            auVar108._4_4_ = auVar195._4_4_ * auVar94._4_4_;
            auVar108._8_4_ = auVar195._8_4_ * auVar94._8_4_;
            auVar108._12_4_ = auVar195._12_4_ * auVar94._12_4_;
            auVar94 = vpmaxsd_avx(auVar92,auVar108);
            auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar86 + 0x20 + uVar83),auVar170._0_16_);
            auVar109._0_4_ = auVar203._0_4_ * auVar92._0_4_;
            auVar109._4_4_ = auVar203._4_4_ * auVar92._4_4_;
            auVar109._8_4_ = auVar203._8_4_ * auVar92._8_4_;
            auVar109._12_4_ = auVar203._12_4_ * auVar92._12_4_;
            auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar86 + 0x20 + uVar84),auVar164._0_16_);
            auVar124._0_4_ = auVar186._0_4_ * auVar92._0_4_;
            auVar124._4_4_ = auVar186._4_4_ * auVar92._4_4_;
            auVar124._8_4_ = auVar186._8_4_ * auVar92._8_4_;
            auVar124._12_4_ = auVar186._12_4_ * auVar92._12_4_;
            auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar86 + 0x20 + uVar79),auVar167._0_16_);
            auVar142._0_4_ = auVar195._0_4_ * auVar92._0_4_;
            auVar142._4_4_ = auVar195._4_4_ * auVar92._4_4_;
            auVar142._8_4_ = auVar195._8_4_ * auVar92._8_4_;
            auVar142._12_4_ = auVar195._12_4_ * auVar92._12_4_;
            auVar154 = vpminsd_avx(auVar124,auVar142);
            auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar86 + 0x20 + uVar87),auVar170._0_16_);
            auVar143._0_4_ = auVar203._0_4_ * auVar92._0_4_;
            auVar143._4_4_ = auVar203._4_4_ * auVar92._4_4_;
            auVar143._8_4_ = auVar203._8_4_ * auVar92._8_4_;
            auVar143._12_4_ = auVar203._12_4_ * auVar92._12_4_;
            auVar92 = vpmaxsd_avx(auVar109,auVar205._0_16_);
            auVar94 = vpmaxsd_avx(auVar94,auVar92);
            auVar92 = vpminsd_avx(auVar143,auVar207._0_16_);
            auVar92 = vpminsd_avx(auVar154,auVar92);
            auVar94 = vpcmpgtd_avx(auVar94,auVar92);
            uVar69 = vmovmskps_avx(auVar94);
            local_b30 = ((ulong)uVar69 ^ 0xf) & 0xff;
          }
          if ((uVar86 & 8) == 0) {
            if (local_b30 == 0) {
              iVar71 = 4;
            }
            else {
              uVar85 = uVar86 & 0xfffffffffffffff0;
              lVar76 = 0;
              if (local_b30 != 0) {
                for (; (local_b30 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
                }
              }
              iVar71 = 0;
              uVar86 = *(ulong *)(uVar85 + lVar76 * 8);
              uVar81 = local_b30 - 1 & local_b30;
              if (uVar81 != 0) {
                *local_b28 = uVar86;
                lVar76 = 0;
                if (uVar81 != 0) {
                  for (; (uVar81 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
                  }
                }
                uVar75 = uVar81 - 1;
                while( true ) {
                  local_b28 = local_b28 + 1;
                  uVar86 = *(ulong *)(uVar85 + lVar76 * 8);
                  uVar75 = uVar75 & uVar81;
                  if (uVar75 == 0) break;
                  *local_b28 = uVar86;
                  lVar76 = 0;
                  if (uVar75 != 0) {
                    for (; (uVar75 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
                    }
                  }
                  uVar81 = uVar75 - 1;
                }
              }
            }
          }
          else {
            iVar71 = 6;
          }
        } while (iVar71 == 0);
        if (iVar71 == 6) {
          local_ae8 = (ulong)((uint)uVar86 & 0xf) - 8;
          bVar90 = local_ae8 != 0;
          if (bVar90) {
            local_ae0 = 0;
            local_af0 = uVar86 & 0xfffffffffffffff0;
            do {
              lVar76 = local_ae0 * 0x58;
              local_ac8 = lVar76 + local_af0;
              auVar93._8_8_ = 0;
              auVar93._0_8_ = *(ulong *)(local_af0 + 0x20 + lVar76);
              auVar110._8_8_ = 0;
              auVar110._0_8_ = *(ulong *)(local_af0 + 0x24 + lVar76);
              auVar92 = vpminub_avx(auVar93,auVar110);
              auVar94 = vpcmpeqb_avx(auVar93,auVar92);
              auVar92 = vpcmpeqd_avx(auVar92,auVar92);
              auVar94 = vpmovzxbd_avx(auVar94 ^ auVar92);
              auVar94 = vpslld_avx(auVar94 ^ auVar92,0x1f);
              uVar70 = vmovmskps_avx(auVar94);
              fVar107 = *(float *)(local_af0 + 0x38 + lVar76);
              fVar100 = *(float *)(local_af0 + 0x44 + lVar76);
              auVar125._8_8_ = 0;
              auVar125._0_8_ = *(ulong *)(local_af8 + 0x20 + local_ac8);
              auVar94 = vpmovzxbd_avx(auVar125);
              auVar94 = vcvtdq2ps_avx(auVar94);
              auVar126._0_4_ = fVar107 + fVar100 * auVar94._0_4_;
              auVar126._4_4_ = fVar107 + fVar100 * auVar94._4_4_;
              auVar126._8_4_ = fVar107 + fVar100 * auVar94._8_4_;
              auVar126._12_4_ = fVar107 + fVar100 * auVar94._12_4_;
              auVar144._8_8_ = 0;
              auVar144._0_8_ = *(ulong *)(local_b00 + 0x20 + local_ac8);
              auVar94 = vpmovzxbd_avx(auVar144);
              auVar94 = vcvtdq2ps_avx(auVar94);
              auVar95._0_4_ = fVar107 + fVar100 * auVar94._0_4_;
              auVar95._4_4_ = fVar107 + fVar100 * auVar94._4_4_;
              auVar95._8_4_ = fVar107 + fVar100 * auVar94._8_4_;
              auVar95._12_4_ = fVar107 + fVar100 * auVar94._12_4_;
              fVar107 = *(float *)(local_af0 + 0x3c + lVar76);
              fVar100 = *(float *)(local_af0 + 0x48 + lVar76);
              auVar149._8_8_ = 0;
              auVar149._0_8_ = *(ulong *)(local_b08 + 0x20 + local_ac8);
              auVar94 = vpmovzxbd_avx(auVar149);
              auVar94 = vcvtdq2ps_avx(auVar94);
              auVar150._0_4_ = fVar107 + fVar100 * auVar94._0_4_;
              auVar150._4_4_ = fVar107 + fVar100 * auVar94._4_4_;
              auVar150._8_4_ = fVar107 + fVar100 * auVar94._8_4_;
              auVar150._12_4_ = fVar107 + fVar100 * auVar94._12_4_;
              auVar156._8_8_ = 0;
              auVar156._0_8_ = *(ulong *)(local_b10 + 0x20 + local_ac8);
              auVar94 = vpmovzxbd_avx(auVar156);
              auVar94 = vcvtdq2ps_avx(auVar94);
              auVar111._0_4_ = fVar107 + fVar100 * auVar94._0_4_;
              auVar111._4_4_ = fVar107 + fVar100 * auVar94._4_4_;
              auVar111._8_4_ = fVar107 + fVar100 * auVar94._8_4_;
              auVar111._12_4_ = fVar107 + fVar100 * auVar94._12_4_;
              fVar107 = *(float *)(local_af0 + 0x4c + lVar76);
              auVar157._8_8_ = 0;
              auVar157._0_8_ = *(ulong *)(local_b18 + 0x20 + local_ac8);
              auVar94 = vpmovzxbd_avx(auVar157);
              auVar94 = vcvtdq2ps_avx(auVar94);
              auVar160._8_8_ = 0;
              auVar160._0_8_ = *(ulong *)(local_b20 + 0x20 + local_ac8);
              auVar92 = vpmovzxbd_avx(auVar160);
              auVar92 = vcvtdq2ps_avx(auVar92);
              fVar100 = *(float *)(local_af0 + 0x40 + lVar76);
              auVar158._0_4_ = fVar100 + fVar107 * auVar94._0_4_;
              auVar158._4_4_ = fVar100 + fVar107 * auVar94._4_4_;
              auVar158._8_4_ = fVar100 + fVar107 * auVar94._8_4_;
              auVar158._12_4_ = fVar100 + fVar107 * auVar94._12_4_;
              auVar145._0_4_ = fVar100 + fVar107 * auVar92._0_4_;
              auVar145._4_4_ = fVar100 + fVar107 * auVar92._4_4_;
              auVar145._8_4_ = fVar100 + fVar107 * auVar92._8_4_;
              auVar145._12_4_ = fVar100 + fVar107 * auVar92._12_4_;
              auVar94 = vsubps_avx(auVar126,auVar164._0_16_);
              auVar127._0_4_ = auVar186._0_4_ * auVar94._0_4_;
              auVar127._4_4_ = auVar186._4_4_ * auVar94._4_4_;
              auVar127._8_4_ = auVar186._8_4_ * auVar94._8_4_;
              auVar127._12_4_ = auVar186._12_4_ * auVar94._12_4_;
              auVar94 = vsubps_avx(auVar150,auVar167._0_16_);
              auVar151._0_4_ = auVar195._0_4_ * auVar94._0_4_;
              auVar151._4_4_ = auVar195._4_4_ * auVar94._4_4_;
              auVar151._8_4_ = auVar195._8_4_ * auVar94._8_4_;
              auVar151._12_4_ = auVar195._12_4_ * auVar94._12_4_;
              auVar94 = vpmaxsd_avx(auVar127,auVar151);
              auVar92 = vsubps_avx(auVar95,auVar164._0_16_);
              auVar96._0_4_ = auVar186._0_4_ * auVar92._0_4_;
              auVar96._4_4_ = auVar186._4_4_ * auVar92._4_4_;
              auVar96._8_4_ = auVar186._8_4_ * auVar92._8_4_;
              auVar96._12_4_ = auVar186._12_4_ * auVar92._12_4_;
              auVar92 = vsubps_avx(auVar111,auVar167._0_16_);
              auVar112._0_4_ = auVar195._0_4_ * auVar92._0_4_;
              auVar112._4_4_ = auVar195._4_4_ * auVar92._4_4_;
              auVar112._8_4_ = auVar195._8_4_ * auVar92._8_4_;
              auVar112._12_4_ = auVar195._12_4_ * auVar92._12_4_;
              auVar154 = vpminsd_avx(auVar96,auVar112);
              auVar92 = vsubps_avx(auVar158,auVar170._0_16_);
              auVar113._0_4_ = auVar203._0_4_ * auVar92._0_4_;
              auVar113._4_4_ = auVar203._4_4_ * auVar92._4_4_;
              auVar113._8_4_ = auVar203._8_4_ * auVar92._8_4_;
              auVar113._12_4_ = auVar203._12_4_ * auVar92._12_4_;
              auVar92 = vpmaxsd_avx(auVar113,auVar205._0_16_);
              auVar94 = vpmaxsd_avx(auVar94,auVar92);
              auVar92 = vsubps_avx(auVar145,auVar170._0_16_);
              auVar128._0_4_ = auVar203._0_4_ * auVar92._0_4_;
              auVar128._4_4_ = auVar203._4_4_ * auVar92._4_4_;
              auVar128._8_4_ = auVar203._8_4_ * auVar92._8_4_;
              auVar128._12_4_ = auVar203._12_4_ * auVar92._12_4_;
              auVar92 = vpminsd_avx(auVar128,auVar207._0_16_);
              auVar92 = vpminsd_avx(auVar154,auVar92);
              auVar94 = vpcmpgtd_avx(auVar94,auVar92);
              uVar74 = vmovmskps_avx(auVar94);
              bVar73 = ~(byte)uVar74 & (byte)uVar70;
              if (bVar73 != 0) {
                uVar79 = (ulong)bVar73;
                do {
                  lVar76 = 0;
                  if (uVar79 != 0) {
                    for (; (uVar79 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
                    }
                  }
                  uVar2 = *(ushort *)(local_ac8 + lVar76 * 8);
                  uVar3 = *(ushort *)(local_ac8 + 2 + lVar76 * 8);
                  uVar69 = *(uint *)(local_ac8 + 0x50);
                  uVar4 = *(uint *)(local_ac8 + 4 + lVar76 * 8);
                  local_ad0 = (ulong)uVar69;
                  pGVar5 = (context->scene->geometries).items[uVar69].ptr;
                  lVar76 = *(long *)&pGVar5->field_0x58;
                  local_ad8 = (ulong)uVar4;
                  lVar77 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4;
                  uVar78 = uVar2 & 0x7fff;
                  uVar80 = uVar3 & 0x7fff;
                  uVar169 = *(uint *)(lVar76 + 4 + lVar77);
                  uVar82 = (ulong)uVar169;
                  uVar83 = (ulong)(uVar169 * uVar80 + *(int *)(lVar76 + lVar77) + uVar78);
                  p_Var6 = pGVar5[1].intersectionFilterN;
                  lVar7 = *(long *)&pGVar5[1].time_range.upper;
                  auVar94 = *(undefined1 (*) [16])(lVar7 + (long)p_Var6 * uVar83);
                  auVar92 = *(undefined1 (*) [16])(lVar7 + (uVar83 + 1) * (long)p_Var6);
                  auVar154 = *(undefined1 (*) [16])(lVar7 + (uVar83 + uVar82) * (long)p_Var6);
                  lVar88 = uVar83 + uVar82 + 1;
                  auVar140 = *(undefined1 (*) [16])(lVar7 + lVar88 * (long)p_Var6);
                  uVar72 = (ulong)(-1 < (short)uVar2);
                  auVar141 = *(undefined1 (*) [16])(lVar7 + (uVar83 + uVar72 + 1) * (long)p_Var6);
                  lVar89 = uVar72 + lVar88;
                  auVar155 = *(undefined1 (*) [16])(lVar7 + lVar89 * (long)p_Var6);
                  uVar72 = 0;
                  if (-1 < (short)uVar3) {
                    uVar72 = uVar82;
                  }
                  auVar108 = *(undefined1 (*) [16])
                              (lVar7 + (uVar83 + uVar82 + uVar72) * (long)p_Var6);
                  auVar109 = *(undefined1 (*) [16])(lVar7 + (lVar88 + uVar72) * (long)p_Var6);
                  auVar124 = *(undefined1 (*) [16])(lVar7 + (uVar72 + lVar89) * (long)p_Var6);
                  auVar143 = vunpcklps_avx(auVar94,auVar140);
                  auVar94 = vunpckhps_avx(auVar94,auVar140);
                  auVar93 = vunpcklps_avx(auVar92,auVar154);
                  auVar142 = vunpckhps_avx(auVar92,auVar154);
                  auVar142 = vunpcklps_avx(auVar94,auVar142);
                  auVar95 = vunpcklps_avx(auVar143,auVar93);
                  auVar94 = vunpckhps_avx(auVar143,auVar93);
                  auVar143 = vunpcklps_avx(auVar92,auVar155);
                  auVar92 = vunpckhps_avx(auVar92,auVar155);
                  auVar93 = vunpcklps_avx(auVar141,auVar140);
                  auVar141 = vunpckhps_avx(auVar141,auVar140);
                  auVar96 = vunpcklps_avx(auVar92,auVar141);
                  auVar110 = vunpcklps_avx(auVar143,auVar93);
                  auVar92 = vunpckhps_avx(auVar143,auVar93);
                  auVar143 = vunpcklps_avx(auVar140,auVar124);
                  auVar141 = vunpckhps_avx(auVar140,auVar124);
                  auVar124 = vunpcklps_avx(auVar155,auVar109);
                  auVar155 = vunpckhps_avx(auVar155,auVar109);
                  auVar155 = vunpcklps_avx(auVar141,auVar155);
                  auVar93 = vunpcklps_avx(auVar143,auVar124);
                  auVar141 = vunpckhps_avx(auVar143,auVar124);
                  auVar124 = vunpcklps_avx(auVar154,auVar109);
                  auVar154 = vunpckhps_avx(auVar154,auVar109);
                  auVar109 = vunpcklps_avx(auVar140,auVar108);
                  auVar140 = vunpckhps_avx(auVar140,auVar108);
                  auVar140 = vunpcklps_avx(auVar154,auVar140);
                  auVar108 = vunpcklps_avx(auVar124,auVar109);
                  auVar154 = vunpckhps_avx(auVar124,auVar109);
                  auVar152._16_16_ = auVar93;
                  auVar152._0_16_ = auVar95;
                  auVar159._16_16_ = auVar141;
                  auVar159._0_16_ = auVar94;
                  auVar163._16_16_ = auVar155;
                  auVar163._0_16_ = auVar142;
                  auVar147._16_16_ = auVar110;
                  auVar147._0_16_ = auVar110;
                  auVar165._16_16_ = auVar92;
                  auVar165._0_16_ = auVar92;
                  auVar129._16_16_ = auVar96;
                  auVar129._0_16_ = auVar96;
                  auVar114._16_16_ = auVar108;
                  auVar114._0_16_ = auVar108;
                  auVar185._16_16_ = auVar154;
                  auVar185._0_16_ = auVar154;
                  auVar194._16_16_ = auVar140;
                  auVar194._0_16_ = auVar140;
                  local_a40 = vsubps_avx(auVar152,auVar147);
                  local_a20 = vsubps_avx(auVar159,auVar165);
                  auVar97 = vsubps_avx(auVar163,auVar129);
                  auVar131 = vsubps_avx(auVar114,auVar152);
                  auVar98 = vsubps_avx(auVar185,auVar159);
                  auVar114 = vsubps_avx(auVar194,auVar163);
                  fVar102 = local_a20._0_4_;
                  fVar193 = auVar114._0_4_;
                  fVar120 = local_a20._4_4_;
                  fVar196 = auVar114._4_4_;
                  auVar52._4_4_ = fVar196 * fVar120;
                  auVar52._0_4_ = fVar193 * fVar102;
                  fVar139 = local_a20._8_4_;
                  fVar197 = auVar114._8_4_;
                  auVar52._8_4_ = fVar197 * fVar139;
                  fVar16 = local_a20._12_4_;
                  fVar198 = auVar114._12_4_;
                  auVar52._12_4_ = fVar198 * fVar16;
                  fVar25 = local_a20._16_4_;
                  fVar199 = auVar114._16_4_;
                  auVar52._16_4_ = fVar199 * fVar25;
                  fVar34 = local_a20._20_4_;
                  fVar200 = auVar114._20_4_;
                  auVar52._20_4_ = fVar200 * fVar34;
                  fVar43 = local_a20._24_4_;
                  fVar201 = auVar114._24_4_;
                  auVar52._24_4_ = fVar201 * fVar43;
                  auVar52._28_4_ = auVar108._12_4_;
                  fVar104 = auVar97._0_4_;
                  fVar184 = auVar98._0_4_;
                  fVar121 = auVar97._4_4_;
                  fVar187 = auVar98._4_4_;
                  auVar53._4_4_ = fVar187 * fVar121;
                  auVar53._0_4_ = fVar184 * fVar104;
                  fVar91 = auVar97._8_4_;
                  fVar188 = auVar98._8_4_;
                  auVar53._8_4_ = fVar188 * fVar91;
                  fVar17 = auVar97._12_4_;
                  fVar189 = auVar98._12_4_;
                  auVar53._12_4_ = fVar189 * fVar17;
                  fVar26 = auVar97._16_4_;
                  fVar190 = auVar98._16_4_;
                  auVar53._16_4_ = fVar190 * fVar26;
                  fVar35 = auVar97._20_4_;
                  fVar191 = auVar98._20_4_;
                  auVar53._20_4_ = fVar191 * fVar35;
                  fVar44 = auVar97._24_4_;
                  uVar56 = auVar96._12_4_;
                  fVar192 = auVar98._24_4_;
                  auVar53._24_4_ = fVar192 * fVar44;
                  auVar53._28_4_ = uVar56;
                  local_a00 = vsubps_avx(auVar53,auVar52);
                  fVar168 = auVar131._0_4_;
                  fVar171 = auVar131._4_4_;
                  auVar54._4_4_ = fVar171 * fVar121;
                  auVar54._0_4_ = fVar168 * fVar104;
                  fVar173 = auVar131._8_4_;
                  auVar54._8_4_ = fVar173 * fVar91;
                  fVar175 = auVar131._12_4_;
                  auVar54._12_4_ = fVar175 * fVar17;
                  fVar177 = auVar131._16_4_;
                  auVar54._16_4_ = fVar177 * fVar26;
                  fVar179 = auVar131._20_4_;
                  auVar54._20_4_ = fVar179 * fVar35;
                  fVar181 = auVar131._24_4_;
                  auVar54._24_4_ = fVar181 * fVar44;
                  auVar54._28_4_ = uVar56;
                  fVar106 = local_a40._0_4_;
                  fVar122 = local_a40._4_4_;
                  auVar55._4_4_ = fVar196 * fVar122;
                  auVar55._0_4_ = fVar193 * fVar106;
                  fVar99 = local_a40._8_4_;
                  auVar55._8_4_ = fVar197 * fVar99;
                  fVar18 = local_a40._12_4_;
                  auVar55._12_4_ = fVar198 * fVar18;
                  fVar27 = local_a40._16_4_;
                  auVar55._16_4_ = fVar199 * fVar27;
                  fVar36 = local_a40._20_4_;
                  auVar55._20_4_ = fVar200 * fVar36;
                  fVar45 = local_a40._24_4_;
                  fVar57 = auVar110._12_4_;
                  auVar55._24_4_ = fVar201 * fVar45;
                  auVar55._28_4_ = fVar57;
                  auVar97 = vsubps_avx(auVar55,auVar54);
                  auVar58._4_4_ = fVar187 * fVar122;
                  auVar58._0_4_ = fVar184 * fVar106;
                  auVar58._8_4_ = fVar188 * fVar99;
                  auVar58._12_4_ = fVar189 * fVar18;
                  auVar58._16_4_ = fVar190 * fVar27;
                  auVar58._20_4_ = fVar191 * fVar36;
                  auVar58._24_4_ = fVar192 * fVar45;
                  auVar58._28_4_ = fVar57;
                  auVar59._4_4_ = fVar171 * fVar120;
                  auVar59._0_4_ = fVar168 * fVar102;
                  auVar59._8_4_ = fVar173 * fVar139;
                  auVar59._12_4_ = fVar175 * fVar16;
                  auVar59._16_4_ = fVar177 * fVar25;
                  auVar59._20_4_ = fVar179 * fVar34;
                  auVar59._24_4_ = fVar181 * fVar43;
                  auVar59._28_4_ = local_a20._28_4_;
                  local_a60 = vsubps_avx(auVar59,auVar58);
                  uVar70 = *(undefined4 *)&(ray->org).field_0;
                  auVar202._4_4_ = uVar70;
                  auVar202._0_4_ = uVar70;
                  auVar202._8_4_ = uVar70;
                  auVar202._12_4_ = uVar70;
                  auVar202._16_4_ = uVar70;
                  auVar202._20_4_ = uVar70;
                  auVar202._24_4_ = uVar70;
                  auVar202._28_4_ = uVar70;
                  uVar70 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
                  auVar204._4_4_ = uVar70;
                  auVar204._0_4_ = uVar70;
                  auVar204._8_4_ = uVar70;
                  auVar204._12_4_ = uVar70;
                  auVar204._16_4_ = uVar70;
                  auVar204._20_4_ = uVar70;
                  auVar204._24_4_ = uVar70;
                  auVar204._28_4_ = uVar70;
                  uVar74 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
                  auVar206._4_4_ = uVar74;
                  auVar206._0_4_ = uVar74;
                  auVar206._8_4_ = uVar74;
                  auVar206._12_4_ = uVar74;
                  auVar206._16_4_ = uVar74;
                  auVar206._20_4_ = uVar74;
                  auVar206._24_4_ = uVar74;
                  auVar206._28_4_ = uVar74;
                  fVar107 = (ray->dir).field_0.m128[1];
                  auVar52 = vsubps_avx(auVar152,auVar202);
                  fVar100 = (ray->dir).field_0.m128[2];
                  auVar53 = vsubps_avx(auVar159,auVar204);
                  auVar54 = vsubps_avx(auVar163,auVar206);
                  fVar103 = auVar54._0_4_;
                  fVar123 = auVar54._4_4_;
                  auVar60._4_4_ = fVar107 * fVar123;
                  auVar60._0_4_ = fVar107 * fVar103;
                  fVar10 = auVar54._8_4_;
                  auVar60._8_4_ = fVar107 * fVar10;
                  fVar19 = auVar54._12_4_;
                  auVar60._12_4_ = fVar107 * fVar19;
                  fVar28 = auVar54._16_4_;
                  auVar60._16_4_ = fVar107 * fVar28;
                  fVar37 = auVar54._20_4_;
                  auVar60._20_4_ = fVar107 * fVar37;
                  fVar46 = auVar54._24_4_;
                  auVar60._24_4_ = fVar107 * fVar46;
                  auVar60._28_4_ = uVar70;
                  fVar105 = auVar53._0_4_;
                  fVar134 = auVar53._4_4_;
                  auVar61._4_4_ = fVar100 * fVar134;
                  auVar61._0_4_ = fVar100 * fVar105;
                  fVar11 = auVar53._8_4_;
                  auVar61._8_4_ = fVar100 * fVar11;
                  fVar20 = auVar53._12_4_;
                  auVar61._12_4_ = fVar100 * fVar20;
                  fVar29 = auVar53._16_4_;
                  auVar61._16_4_ = fVar100 * fVar29;
                  fVar38 = auVar53._20_4_;
                  auVar61._20_4_ = fVar100 * fVar38;
                  fVar47 = auVar53._24_4_;
                  auVar61._24_4_ = fVar100 * fVar47;
                  auVar61._28_4_ = uVar74;
                  auVar53 = vsubps_avx(auVar61,auVar60);
                  fVar101 = (ray->dir).field_0.m128[0];
                  fVar116 = auVar52._0_4_;
                  fVar135 = auVar52._4_4_;
                  auVar62._4_4_ = fVar100 * fVar135;
                  auVar62._0_4_ = fVar100 * fVar116;
                  fVar12 = auVar52._8_4_;
                  auVar62._8_4_ = fVar100 * fVar12;
                  fVar21 = auVar52._12_4_;
                  auVar62._12_4_ = fVar100 * fVar21;
                  fVar30 = auVar52._16_4_;
                  auVar62._16_4_ = fVar100 * fVar30;
                  fVar39 = auVar52._20_4_;
                  auVar62._20_4_ = fVar100 * fVar39;
                  fVar48 = auVar52._24_4_;
                  auVar62._24_4_ = fVar100 * fVar48;
                  auVar62._28_4_ = local_a00._28_4_;
                  auVar63._4_4_ = fVar101 * fVar123;
                  auVar63._0_4_ = fVar101 * fVar103;
                  auVar63._8_4_ = fVar101 * fVar10;
                  auVar63._12_4_ = fVar101 * fVar19;
                  auVar63._16_4_ = fVar101 * fVar28;
                  auVar63._20_4_ = fVar101 * fVar37;
                  auVar63._24_4_ = fVar101 * fVar46;
                  auVar63._28_4_ = uVar56;
                  auVar52 = vsubps_avx(auVar63,auVar62);
                  auVar64._4_4_ = fVar101 * fVar134;
                  auVar64._0_4_ = fVar101 * fVar105;
                  auVar64._8_4_ = fVar101 * fVar11;
                  auVar64._12_4_ = fVar101 * fVar20;
                  auVar64._16_4_ = fVar101 * fVar29;
                  auVar64._20_4_ = fVar101 * fVar38;
                  auVar64._24_4_ = fVar101 * fVar47;
                  auVar64._28_4_ = uVar56;
                  auVar65._4_4_ = fVar107 * fVar135;
                  auVar65._0_4_ = fVar107 * fVar116;
                  auVar65._8_4_ = fVar107 * fVar12;
                  auVar65._12_4_ = fVar107 * fVar21;
                  auVar65._16_4_ = fVar107 * fVar30;
                  auVar65._20_4_ = fVar107 * fVar39;
                  auVar65._24_4_ = fVar107 * fVar48;
                  auVar65._28_4_ = fVar57;
                  auVar55 = vsubps_avx(auVar65,auVar64);
                  fVar117 = local_a60._0_4_;
                  fVar136 = local_a60._4_4_;
                  fVar13 = local_a60._8_4_;
                  fVar22 = local_a60._12_4_;
                  fVar31 = local_a60._16_4_;
                  fVar40 = local_a60._20_4_;
                  fVar49 = local_a60._24_4_;
                  fVar118 = auVar97._0_4_;
                  fVar137 = auVar97._4_4_;
                  fVar14 = auVar97._8_4_;
                  fVar23 = auVar97._12_4_;
                  fVar32 = auVar97._16_4_;
                  fVar41 = auVar97._20_4_;
                  fVar50 = auVar97._24_4_;
                  fVar119 = local_a00._0_4_;
                  fVar138 = local_a00._4_4_;
                  fVar15 = local_a00._8_4_;
                  fVar24 = local_a00._12_4_;
                  fVar33 = local_a00._16_4_;
                  fVar42 = local_a00._20_4_;
                  fVar51 = local_a00._24_4_;
                  auVar148._0_4_ = fVar101 * fVar119 + fVar107 * fVar118 + fVar100 * fVar117;
                  auVar148._4_4_ = fVar101 * fVar138 + fVar107 * fVar137 + fVar100 * fVar136;
                  auVar148._8_4_ = fVar101 * fVar15 + fVar107 * fVar14 + fVar100 * fVar13;
                  auVar148._12_4_ = fVar101 * fVar24 + fVar107 * fVar23 + fVar100 * fVar22;
                  auVar148._16_4_ = fVar101 * fVar33 + fVar107 * fVar32 + fVar100 * fVar31;
                  auVar148._20_4_ = fVar101 * fVar42 + fVar107 * fVar41 + fVar100 * fVar40;
                  auVar148._24_4_ = fVar101 * fVar51 + fVar107 * fVar50 + fVar100 * fVar49;
                  auVar148._28_4_ = fVar100 + fVar100 + fVar57;
                  auVar130._8_4_ = 0x80000000;
                  auVar130._0_8_ = 0x8000000080000000;
                  auVar130._12_4_ = 0x80000000;
                  auVar130._16_4_ = 0x80000000;
                  auVar130._20_4_ = 0x80000000;
                  auVar130._24_4_ = 0x80000000;
                  auVar130._28_4_ = 0x80000000;
                  auVar97 = vandps_avx(auVar148,auVar130);
                  uVar169 = auVar97._0_4_;
                  auVar161._0_4_ =
                       (float)(uVar169 ^
                              (uint)(fVar168 * auVar53._0_4_ +
                                    fVar184 * auVar52._0_4_ + fVar193 * auVar55._0_4_));
                  uVar172 = auVar97._4_4_;
                  auVar161._4_4_ =
                       (float)(uVar172 ^
                              (uint)(fVar171 * auVar53._4_4_ +
                                    fVar187 * auVar52._4_4_ + fVar196 * auVar55._4_4_));
                  uVar174 = auVar97._8_4_;
                  auVar161._8_4_ =
                       (float)(uVar174 ^
                              (uint)(fVar173 * auVar53._8_4_ +
                                    fVar188 * auVar52._8_4_ + fVar197 * auVar55._8_4_));
                  uVar176 = auVar97._12_4_;
                  auVar161._12_4_ =
                       (float)(uVar176 ^
                              (uint)(fVar175 * auVar53._12_4_ +
                                    fVar189 * auVar52._12_4_ + fVar198 * auVar55._12_4_));
                  uVar178 = auVar97._16_4_;
                  auVar161._16_4_ =
                       (float)(uVar178 ^
                              (uint)(fVar177 * auVar53._16_4_ +
                                    fVar190 * auVar52._16_4_ + fVar199 * auVar55._16_4_));
                  uVar180 = auVar97._20_4_;
                  auVar161._20_4_ =
                       (float)(uVar180 ^
                              (uint)(fVar179 * auVar53._20_4_ +
                                    fVar191 * auVar52._20_4_ + fVar200 * auVar55._20_4_));
                  uVar182 = auVar97._24_4_;
                  auVar161._24_4_ =
                       (float)(uVar182 ^
                              (uint)(fVar181 * auVar53._24_4_ +
                                    fVar192 * auVar52._24_4_ + fVar201 * auVar55._24_4_));
                  uVar183 = auVar97._28_4_;
                  auVar161._28_4_ =
                       (float)(uVar183 ^ (uint)(auVar131._28_4_ + auVar98._28_4_ + auVar114._28_4_))
                  ;
                  auVar166._0_4_ =
                       (float)(uVar169 ^
                              (uint)(auVar53._0_4_ * fVar106 +
                                    auVar52._0_4_ * fVar102 + fVar104 * auVar55._0_4_));
                  auVar166._4_4_ =
                       (float)(uVar172 ^
                              (uint)(auVar53._4_4_ * fVar122 +
                                    auVar52._4_4_ * fVar120 + fVar121 * auVar55._4_4_));
                  auVar166._8_4_ =
                       (float)(uVar174 ^
                              (uint)(auVar53._8_4_ * fVar99 +
                                    auVar52._8_4_ * fVar139 + fVar91 * auVar55._8_4_));
                  auVar166._12_4_ =
                       (float)(uVar176 ^
                              (uint)(auVar53._12_4_ * fVar18 +
                                    auVar52._12_4_ * fVar16 + fVar17 * auVar55._12_4_));
                  auVar166._16_4_ =
                       (float)(uVar178 ^
                              (uint)(auVar53._16_4_ * fVar27 +
                                    auVar52._16_4_ * fVar25 + fVar26 * auVar55._16_4_));
                  auVar166._20_4_ =
                       (float)(uVar180 ^
                              (uint)(auVar53._20_4_ * fVar36 +
                                    auVar52._20_4_ * fVar34 + fVar35 * auVar55._20_4_));
                  auVar166._24_4_ =
                       (float)(uVar182 ^
                              (uint)(auVar53._24_4_ * fVar45 +
                                    auVar52._24_4_ * fVar43 + fVar44 * auVar55._24_4_));
                  auVar166._28_4_ =
                       (float)(uVar183 ^ (uint)(local_a00._28_4_ + auVar52._28_4_ + auVar55._28_4_))
                  ;
                  auVar131 = ZEXT1232(ZEXT812(0)) << 0x20;
                  auVar97 = vcmpps_avx(auVar161,auVar131,5);
                  auVar131 = vcmpps_avx(auVar166,auVar131,5);
                  auVar97 = vandps_avx(auVar97,auVar131);
                  auVar98._8_4_ = 0x7fffffff;
                  auVar98._0_8_ = 0x7fffffff7fffffff;
                  auVar98._12_4_ = 0x7fffffff;
                  auVar98._16_4_ = 0x7fffffff;
                  auVar98._20_4_ = 0x7fffffff;
                  auVar98._24_4_ = 0x7fffffff;
                  auVar98._28_4_ = 0x7fffffff;
                  local_960 = vandps_avx(auVar148,auVar98);
                  auVar131 = vcmpps_avx(auVar148,ZEXT1232(ZEXT812(0)) << 0x20,4);
                  auVar97 = vandps_avx(auVar97,auVar131);
                  auVar132._0_4_ = auVar166._0_4_ + auVar161._0_4_;
                  auVar132._4_4_ = auVar166._4_4_ + auVar161._4_4_;
                  auVar132._8_4_ = auVar166._8_4_ + auVar161._8_4_;
                  auVar132._12_4_ = auVar166._12_4_ + auVar161._12_4_;
                  auVar132._16_4_ = auVar166._16_4_ + auVar161._16_4_;
                  auVar132._20_4_ = auVar166._20_4_ + auVar161._20_4_;
                  auVar132._24_4_ = auVar166._24_4_ + auVar161._24_4_;
                  auVar132._28_4_ = auVar166._28_4_ + auVar161._28_4_;
                  auVar98 = vcmpps_avx(auVar132,local_960,2);
                  auVar131 = vandps_avx(auVar97,auVar98);
                  auVar114 = local_9e0 & auVar131;
                  if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar114 >> 0x7f,0) != '\0') ||
                        (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar114 >> 0xbf,0) != '\0') ||
                      (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar114[0x1f] < '\0') {
                    auVar131 = vandps_avx(auVar131,local_9e0);
                    local_980._0_4_ =
                         (float)(uVar169 ^
                                (uint)(fVar119 * fVar116 + fVar118 * fVar105 + fVar103 * fVar117));
                    local_980._4_4_ =
                         (float)(uVar172 ^
                                (uint)(fVar138 * fVar135 + fVar137 * fVar134 + fVar123 * fVar136));
                    local_980._8_4_ =
                         (float)(uVar174 ^
                                (uint)(fVar15 * fVar12 + fVar14 * fVar11 + fVar10 * fVar13));
                    local_980._12_4_ =
                         (float)(uVar176 ^
                                (uint)(fVar24 * fVar21 + fVar23 * fVar20 + fVar19 * fVar22));
                    local_980._16_4_ =
                         (float)(uVar178 ^
                                (uint)(fVar33 * fVar30 + fVar32 * fVar29 + fVar28 * fVar31));
                    local_980._20_4_ =
                         (float)(uVar180 ^
                                (uint)(fVar42 * fVar39 + fVar41 * fVar38 + fVar37 * fVar40));
                    local_980._24_4_ =
                         (float)(uVar182 ^
                                (uint)(fVar51 * fVar48 + fVar50 * fVar47 + fVar46 * fVar49));
                    local_980._28_4_ =
                         uVar183 ^ (uint)(auVar98._28_4_ + auVar98._28_4_ + auVar97._28_4_);
                    fVar107 = (ray->org).field_0.m128[3];
                    fVar100 = local_960._0_4_;
                    fVar101 = local_960._4_4_;
                    auVar66._4_4_ = fVar101 * fVar107;
                    auVar66._0_4_ = fVar100 * fVar107;
                    fVar102 = local_960._8_4_;
                    auVar66._8_4_ = fVar102 * fVar107;
                    fVar104 = local_960._12_4_;
                    auVar66._12_4_ = fVar104 * fVar107;
                    fVar106 = local_960._16_4_;
                    auVar66._16_4_ = fVar106 * fVar107;
                    fVar103 = local_960._20_4_;
                    auVar66._20_4_ = fVar103 * fVar107;
                    fVar105 = local_960._24_4_;
                    auVar66._24_4_ = fVar105 * fVar107;
                    auVar66._28_4_ = fVar107;
                    auVar97 = vcmpps_avx(auVar66,local_980,1);
                    fVar107 = ray->tfar;
                    auVar67._4_4_ = fVar101 * fVar107;
                    auVar67._0_4_ = fVar100 * fVar107;
                    auVar67._8_4_ = fVar102 * fVar107;
                    auVar67._12_4_ = fVar104 * fVar107;
                    auVar67._16_4_ = fVar106 * fVar107;
                    auVar67._20_4_ = fVar103 * fVar107;
                    auVar67._24_4_ = fVar105 * fVar107;
                    auVar67._28_4_ = fVar107;
                    auVar98 = vcmpps_avx(local_980,auVar67,2);
                    auVar97 = vandps_avx(auVar98,auVar97);
                    auVar98 = auVar131 & auVar97;
                    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar98 >> 0x7f,0) != '\0') ||
                          (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar98 >> 0xbf,0) != '\0') ||
                        (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar98[0x1f] < '\0') {
                      local_920 = vandps_avx(auVar131,auVar97);
                      auVar97 = vsubps_avx(local_960,auVar166);
                      auVar97 = vblendvps_avx(auVar161,auVar97,local_820);
                      auVar131 = vsubps_avx(local_960,auVar161);
                      auVar131 = vblendvps_avx(auVar166,auVar131,local_820);
                      local_8a0[0] = fVar119 * (float)local_840._0_4_;
                      local_8a0[1] = fVar138 * (float)local_840._4_4_;
                      local_8a0[2] = fVar15 * fStack_838;
                      local_8a0[3] = fVar24 * fStack_834;
                      fStack_890 = fVar33 * fStack_830;
                      fStack_88c = fVar42 * fStack_82c;
                      fStack_888 = fVar51 * fStack_828;
                      fStack_884 = auVar166._28_4_;
                      local_880[0] = fVar118 * (float)local_840._0_4_;
                      local_880[1] = fVar137 * (float)local_840._4_4_;
                      local_880[2] = fVar14 * fStack_838;
                      local_880[3] = fVar23 * fStack_834;
                      fStack_870 = fVar32 * fStack_830;
                      fStack_86c = fVar41 * fStack_82c;
                      fStack_868 = fVar50 * fStack_828;
                      fStack_864 = auVar166._28_4_;
                      local_860[0] = (float)local_840._0_4_ * fVar117;
                      local_860[1] = (float)local_840._4_4_ * fVar136;
                      local_860[2] = fStack_838 * fVar13;
                      local_860[3] = fStack_834 * fVar22;
                      fStack_850 = fStack_830 * fVar31;
                      fStack_84c = fStack_82c * fVar40;
                      fStack_848 = fStack_828 * fVar49;
                      fStack_844 = auVar166._28_4_;
                      auVar94 = vpshufd_avx(ZEXT416(uVar78),0);
                      auVar94 = vpaddd_avx(auVar94,_DAT_0201c990);
                      auVar92 = vpshufd_avx(ZEXT416(uVar80),0);
                      auVar92 = vpaddd_avx(auVar92,_DAT_0201c9a0);
                      auVar146._0_4_ = (float)(int)(*(ushort *)(lVar76 + 8 + lVar77) - 1);
                      auVar162._4_12_ = auVar54._4_12_;
                      auVar146._4_12_ = auVar162._4_12_;
                      auVar154 = vrcpss_avx(auVar146,auVar146);
                      auVar162._0_4_ = (float)(int)(*(ushort *)(lVar76 + 10 + lVar77) - 1);
                      auVar140 = vrcpss_avx(auVar162,auVar162);
                      auVar115._16_16_ = auVar94;
                      auVar115._0_16_ = auVar94;
                      auVar98 = vcvtdq2ps_avx(auVar115);
                      fVar122 = auVar98._28_4_ + auVar97._28_4_;
                      auVar94 = ZEXT416((uint)(auVar154._0_4_ *
                                              (2.0 - auVar154._0_4_ * auVar146._0_4_)));
                      auVar94 = vshufps_avx(auVar94,auVar94,0);
                      fVar107 = (fVar100 * auVar98._0_4_ + auVar97._0_4_) * auVar94._0_4_;
                      fVar116 = (fVar101 * auVar98._4_4_ + auVar97._4_4_) * auVar94._4_4_;
                      local_9c0._4_4_ = fVar116;
                      local_9c0._0_4_ = fVar107;
                      fVar117 = (fVar102 * auVar98._8_4_ + auVar97._8_4_) * auVar94._8_4_;
                      local_9c0._8_4_ = fVar117;
                      fVar118 = (fVar104 * auVar98._12_4_ + auVar97._12_4_) * auVar94._12_4_;
                      local_9c0._12_4_ = fVar118;
                      fVar119 = (fVar106 * auVar98._16_4_ + auVar97._16_4_) * auVar94._0_4_;
                      local_9c0._16_4_ = fVar119;
                      fVar120 = (fVar103 * auVar98._20_4_ + auVar97._20_4_) * auVar94._4_4_;
                      local_9c0._20_4_ = fVar120;
                      fVar121 = (fVar105 * auVar98._24_4_ + auVar97._24_4_) * auVar94._8_4_;
                      local_9c0._24_4_ = fVar121;
                      local_9c0._28_4_ = fVar122;
                      auVar133._16_16_ = auVar92;
                      auVar133._0_16_ = auVar92;
                      auVar97 = vcvtdq2ps_avx(auVar133);
                      auVar94 = ZEXT416((uint)(auVar140._0_4_ *
                                              (2.0 - auVar140._0_4_ * auVar162._0_4_)));
                      auVar94 = vshufps_avx(auVar94,auVar94,0);
                      fVar123 = (fVar100 * auVar97._0_4_ + auVar131._0_4_) * auVar94._0_4_;
                      fVar134 = (fVar101 * auVar97._4_4_ + auVar131._4_4_) * auVar94._4_4_;
                      local_9a0._4_4_ = fVar134;
                      local_9a0._0_4_ = fVar123;
                      fVar135 = (fVar102 * auVar97._8_4_ + auVar131._8_4_) * auVar94._8_4_;
                      local_9a0._8_4_ = fVar135;
                      fVar136 = (fVar104 * auVar97._12_4_ + auVar131._12_4_) * auVar94._12_4_;
                      local_9a0._12_4_ = fVar136;
                      fVar137 = (fVar106 * auVar97._16_4_ + auVar131._16_4_) * auVar94._0_4_;
                      local_9a0._16_4_ = fVar137;
                      fVar138 = (fVar103 * auVar97._20_4_ + auVar131._20_4_) * auVar94._4_4_;
                      local_9a0._20_4_ = fVar138;
                      fVar139 = (fVar105 * auVar97._24_4_ + auVar131._24_4_) * auVar94._8_4_;
                      local_9a0._24_4_ = fVar139;
                      local_9a0._28_4_ = auVar97._28_4_ + auVar131._28_4_;
                      if ((pGVar5->mask & ray->mask) != 0) {
                        pRVar8 = context->args;
                        if ((pRVar8->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar97 = vrcpps_avx(local_960);
                          fVar91 = auVar97._0_4_;
                          fVar99 = auVar97._4_4_;
                          auVar68._4_4_ = fVar101 * fVar99;
                          auVar68._0_4_ = fVar100 * fVar91;
                          fVar100 = auVar97._8_4_;
                          auVar68._8_4_ = fVar102 * fVar100;
                          fVar101 = auVar97._12_4_;
                          auVar68._12_4_ = fVar104 * fVar101;
                          fVar102 = auVar97._16_4_;
                          auVar68._16_4_ = fVar106 * fVar102;
                          fVar104 = auVar97._20_4_;
                          auVar68._20_4_ = fVar103 * fVar104;
                          fVar106 = auVar97._24_4_;
                          auVar68._24_4_ = fVar105 * fVar106;
                          auVar68._28_4_ = local_960._28_4_;
                          auVar153._8_4_ = 0x3f800000;
                          auVar153._0_8_ = &DAT_3f8000003f800000;
                          auVar153._12_4_ = 0x3f800000;
                          auVar153._16_4_ = 0x3f800000;
                          auVar153._20_4_ = 0x3f800000;
                          auVar153._24_4_ = 0x3f800000;
                          auVar153._28_4_ = 0x3f800000;
                          auVar131 = vsubps_avx(auVar153,auVar68);
                          fVar91 = fVar91 + fVar91 * auVar131._0_4_;
                          fVar99 = fVar99 + fVar99 * auVar131._4_4_;
                          fVar100 = fVar100 + fVar100 * auVar131._8_4_;
                          fVar101 = fVar101 + fVar101 * auVar131._12_4_;
                          fVar102 = fVar102 + fVar102 * auVar131._16_4_;
                          fVar104 = fVar104 + fVar104 * auVar131._20_4_;
                          fVar106 = fVar106 + fVar106 * auVar131._24_4_;
                          local_8c0._4_4_ = fVar99 * local_980._4_4_;
                          local_8c0._0_4_ = fVar91 * local_980._0_4_;
                          local_8c0._8_4_ = fVar100 * local_980._8_4_;
                          local_8c0._12_4_ = fVar101 * local_980._12_4_;
                          local_8c0._16_4_ = fVar102 * local_980._16_4_;
                          local_8c0._20_4_ = fVar104 * local_980._20_4_;
                          local_8c0._24_4_ = fVar106 * local_980._24_4_;
                          local_8c0._28_4_ = auVar97._28_4_;
                          local_900._4_4_ = fVar116 * fVar99;
                          local_900._0_4_ = fVar107 * fVar91;
                          local_900._8_4_ = fVar117 * fVar100;
                          local_900._12_4_ = fVar118 * fVar101;
                          local_900._16_4_ = fVar119 * fVar102;
                          local_900._20_4_ = fVar120 * fVar104;
                          local_900._24_4_ = fVar121 * fVar106;
                          local_900._28_4_ = fVar122;
                          local_8e0[0] = fVar123 * fVar91;
                          local_8e0[1] = fVar134 * fVar99;
                          local_8e0[2] = fVar135 * fVar100;
                          local_8e0[3] = fVar136 * fVar101;
                          fStack_8d0 = fVar137 * fVar102;
                          fStack_8cc = fVar138 * fVar104;
                          fStack_8c8 = fVar139 * fVar106;
                          fStack_8c4 = auVar97._28_4_ + auVar131._28_4_;
                          iVar71 = vmovmskps_avx(local_920);
                          uVar72 = CONCAT44((int)((ulong)context >> 0x20),iVar71);
                          lVar76 = 0;
                          if (uVar72 != 0) {
                            for (; (uVar72 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
                            }
                          }
                          local_a40._0_8_ = lVar76;
                          local_a20._0_8_ = uVar72;
                          local_a60[0] = iVar71 != 0;
                          if (iVar71 != 0) {
                            pRVar9 = context->user;
                            do {
                              local_ab4 = *(undefined4 *)(local_900 + local_a40._0_8_ * 4);
                              local_ab0 = local_8e0[local_a40._0_8_];
                              local_a00._0_4_ = ray->tfar;
                              ray->tfar = *(float *)(local_8c0 + local_a40._0_8_ * 4);
                              local_ac0 = local_8a0[local_a40._0_8_];
                              local_abc = local_880[local_a40._0_8_];
                              local_ab8 = local_860[local_a40._0_8_];
                              local_aac = uVar4;
                              local_aa8 = uVar69;
                              local_aa4 = pRVar9->instID[0];
                              local_aa0 = pRVar9->instPrimID[0];
                              local_be4 = -1;
                              local_a90.valid = &local_be4;
                              local_a90.geometryUserPtr = pGVar5->userPtr;
                              local_a90.context = pRVar9;
                              local_a90.ray = (RTCRayN *)ray;
                              local_a90.hit = (RTCHitN *)&local_ac0;
                              local_a90.N = 1;
                              if ((pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                                 ((*pGVar5->occlusionFilterN)(&local_a90), *local_a90.valid != 0)) {
                                if (pRVar8->filter == (RTCFilterFunctionN)0x0) break;
                                if (((pRVar8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar8->filter)(&local_a90);
                                }
                                if (*local_a90.valid != 0) break;
                              }
                              ray->tfar = (float)local_a00._0_4_;
                              uVar72 = local_a20._0_8_ ^ 1L << (local_a40._0_8_ & 0x3f);
                              lVar76 = 0;
                              if (uVar72 != 0) {
                                for (; (uVar72 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
                                }
                              }
                              local_a40._0_8_ = lVar76;
                              local_a20._0_8_ = uVar72;
                              local_a60[0] = uVar72 != 0;
                            } while (uVar72 != 0);
                          }
                          if ((local_a60 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                          goto LAB_002e67c2;
                        }
                        auVar164 = ZEXT1664(local_b70);
                        auVar167 = ZEXT1664(local_b80);
                        auVar170 = ZEXT1664(local_b90);
                        auVar186 = ZEXT1664(local_ba0);
                        auVar195 = ZEXT1664(local_bb0);
                        auVar203 = ZEXT1664(local_bc0);
                        auVar205 = ZEXT1664(local_bd0);
                        auVar207 = ZEXT1664(local_be0);
                        goto LAB_002e6c51;
                      }
                    }
                  }
LAB_002e67c2:
                  uVar79 = uVar79 & uVar79 - 1;
                } while (uVar79 != 0);
              }
              local_ae0 = local_ae0 + 1;
              bVar90 = local_ae0 < local_ae8;
              auVar164 = ZEXT1664(local_b70);
              auVar167 = ZEXT1664(local_b80);
              auVar170 = ZEXT1664(local_b90);
              auVar186 = ZEXT1664(local_ba0);
              auVar195 = ZEXT1664(local_bb0);
              auVar203 = ZEXT1664(local_bc0);
              auVar205 = ZEXT1664(local_bd0);
              auVar207 = ZEXT1664(local_be0);
            } while (local_ae0 != local_ae8);
          }
LAB_002e6c51:
          iVar71 = 0;
          uVar79 = local_b58;
          uVar72 = local_b38;
          uVar82 = local_b40;
          uVar83 = local_b48;
          uVar84 = local_b50;
          uVar87 = local_b60;
          if (bVar90) {
            ray->tfar = -INFINITY;
            iVar71 = 3;
          }
        }
        unaff_R12 = local_b30;
      } while (iVar71 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }